

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3SnippetAdvance(char **ppIter,int *piIter,int iNext)

{
  int local_2c;
  char *pcStack_28;
  int iIter;
  char *pIter;
  int *piStack_18;
  int iNext_local;
  int *piIter_local;
  char **ppIter_local;
  
  pcStack_28 = *ppIter;
  if (pcStack_28 != (char *)0x0) {
    local_2c = *piIter;
    pIter._4_4_ = iNext;
    piStack_18 = piIter;
    piIter_local = (int *)ppIter;
    while (local_2c < pIter._4_4_) {
      if (((int)*pcStack_28 & 0xfeU) == 0) {
        local_2c = -1;
        pcStack_28 = (char *)0x0;
        break;
      }
      fts3GetDeltaPosition(&stack0xffffffffffffffd8,&local_2c);
    }
    *piStack_18 = local_2c;
    *(char **)piIter_local = pcStack_28;
  }
  return;
}

Assistant:

static void fts3SnippetAdvance(char **ppIter, int *piIter, int iNext){
  char *pIter = *ppIter;
  if( pIter ){
    int iIter = *piIter;

    while( iIter<iNext ){
      if( 0==(*pIter & 0xFE) ){
        iIter = -1;
        pIter = 0;
        break;
      }
      fts3GetDeltaPosition(&pIter, &iIter);
    }

    *piIter = iIter;
    *ppIter = pIter;
  }
}